

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerator.cpp
# Opt level: O0

Event * __thiscall SignalGenerator::update(SignalGenerator *this,double n_dt)

{
  Event *pEVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  double signalValue;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff88;
  normal_distribution<double> *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  Logging *in_stack_ffffffffffffffb0;
  
  if (0.0 < **(double **)(in_RDI + 0x28)) {
    dVar3 = **(double **)(in_RDI + 0x28);
    dVar2 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(dVar3 * 6.2831853071794 * dVar2);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 8)) {
    dVar3 = *(double *)(*(long *)(in_RDI + 0x28) + 8);
    dVar2 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(dVar3 * 6.2831853071794 * dVar2);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x10)) {
    dVar3 = *(double *)(*(long *)(in_RDI + 0x28) + 0x10);
    dVar2 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(dVar3 * 6.2831853071794 * dVar2);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x18)) {
    in_stack_ffffffffffffffb0 =
         (Logging *)(*(double *)(*(long *)(in_RDI + 0x28) + 0x18) * 6.2831853071794);
    dVar3 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin((double)in_stack_ffffffffffffffb0 * dVar3);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x20)) {
    in_stack_ffffffffffffffa8 = *(double *)(*(long *)(in_RDI + 0x28) + 0x20) * 6.2831853071794;
    dVar3 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(in_stack_ffffffffffffffa8 * dVar3);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x28)) {
    in_stack_ffffffffffffffa0 = *(double *)(*(long *)(in_RDI + 0x28) + 0x28) * 6.2831853071794;
    dVar3 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(in_stack_ffffffffffffffa0 * dVar3);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x30)) {
    in_stack_ffffffffffffff98 = *(double *)(*(long *)(in_RDI + 0x28) + 0x30) * 6.2831853071794;
    dVar3 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin(in_stack_ffffffffffffff98 * dVar3);
  }
  if (0.0 < *(double *)(*(long *)(in_RDI + 0x28) + 0x50)) {
    std::normal_distribution<double>::operator()
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  Logging::logValue(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8,
                    (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                    SUB84(in_stack_ffffffffffffffa0,0),in_stack_ffffffffffffff98);
  pEVar1 = (Event *)operator_new(0x20);
  ValueEvent::ValueEvent((ValueEvent *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return pEVar1;
}

Assistant:

Event* SignalGenerator::update(double n_dt) {
    double signalValue = 0;
    if(param->f1 > 0)
        signalValue += sin(2*3.1415926535897*param->f1*clock->getCurrentTime());
    if(param->f2 > 0)
        signalValue += sin(2*3.1415926535897*param->f2*clock->getCurrentTime());
    if(param->f3 > 0)
        signalValue += sin(2*3.1415926535897*param->f3*clock->getCurrentTime());
    if(param->f4 > 0)
        signalValue += sin(2*3.1415926535897*param->f4*clock->getCurrentTime());
    if(param->f5 > 0)
        signalValue += sin(2*3.1415926535897*param->f5*clock->getCurrentTime());
    if(param->f6 > 0)
        signalValue += sin(2*3.1415926535897*param->f6*clock->getCurrentTime());
    if(param->f7 > 0)
        signalValue += sin(2*3.1415926535897*param->f7*clock->getCurrentTime());
    signalValue *= param->scale;
    signalValue += param->offset;
    if(param->noiseStd > 0) {
        signalValue += distribution(generator);
    }  
    logger->logValue(999, 0, EventType::Value, signalValue);
    return new ValueEvent(signalValue);
}